

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

size_t replace_url_encoded_space_by_plus(char *url)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  long lVar5;
  
  sVar1 = strlen(url);
  if (sVar1 == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    sVar3 = 0;
    do {
      cVar4 = url[sVar3];
      if (((cVar4 == '%') && (url[sVar3 + 1] == '2')) && (url[sVar3 + 2] == '0')) {
        lVar5 = 3;
        cVar4 = '+';
LAB_00111e49:
        url[sVar2] = cVar4;
      }
      else {
        lVar5 = 1;
        if (sVar2 != sVar3) goto LAB_00111e49;
      }
      sVar3 = sVar3 + lVar5;
      sVar2 = sVar2 + 1;
    } while (sVar3 < sVar1);
  }
  url[sVar2] = '\0';
  return sVar2;
}

Assistant:

static size_t replace_url_encoded_space_by_plus(char *url)
{
  size_t orig_len = strlen(url);
  size_t orig_index = 0;
  size_t new_index = 0;

  while(orig_index < orig_len) {
    if((url[orig_index] == '%') &&
       (url[orig_index + 1] == '2') &&
       (url[orig_index + 2] == '0')) {
      url[new_index] = '+';
      orig_index += 3;
    }
    else{
      if(new_index != orig_index) {
        url[new_index] = url[orig_index];
      }
      orig_index++;
    }
    new_index++;
  }

  url[new_index] = 0; /* terminate string */

  return new_index; /* new size */
}